

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O2

int gz_init(gz_statep state)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  
  uVar1 = state->want;
  puVar3 = (uchar *)malloc((ulong)(uVar1 * 2));
  state->in = puVar3;
  if (puVar3 != (uchar *)0x0) {
    if (state->direct != 0) {
      state->size = uVar1;
      return 0;
    }
    puVar4 = (uchar *)malloc((ulong)uVar1);
    state->out = puVar4;
    if (puVar4 != (uchar *)0x0) {
      (state->strm).opaque = (voidpf)0x0;
      (state->strm).zalloc = (alloc_func)0x0;
      (state->strm).zfree = (free_func)0x0;
      iVar2 = deflateInit2_(&state->strm,state->level,8,0x1f,8,state->strategy,"1.3.0.1-motley",0x70
                           );
      if (iVar2 == 0) {
        (state->strm).next_in = (Bytef *)0x0;
        state->size = state->want;
        if (state->direct != 0) {
          return 0;
        }
        (state->strm).avail_out = state->want;
        puVar3 = state->out;
        (state->strm).next_out = puVar3;
        (state->x).next = puVar3;
        return 0;
      }
      free(state->out);
      puVar3 = state->in;
    }
    free(puVar3);
  }
  gz_error(state,-4,"out of memory");
  return -1;
}

Assistant:

local int gz_init(gz_statep state) {
    int ret;
    z_streamp strm = &(state->strm);

    /* allocate input buffer (double size for gzprintf) */
    state->in = (unsigned char *)malloc(state->want << 1);
    if (state->in == NULL) {
        gz_error(state, Z_MEM_ERROR, "out of memory");
        return -1;
    }

    /* only need output buffer and deflate state if compressing */
    if (!state->direct) {
        /* allocate output buffer */
        state->out = (unsigned char *)malloc(state->want);
        if (state->out == NULL) {
            free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }

        /* allocate deflate memory, set up for gzip compression */
        strm->zalloc = Z_NULL;
        strm->zfree = Z_NULL;
        strm->opaque = Z_NULL;
        ret = deflateInit2(strm, state->level, Z_DEFLATED,
                           MAX_WBITS + 16, DEF_MEM_LEVEL, state->strategy);
        if (ret != Z_OK) {
            free(state->out);
            free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        strm->next_in = NULL;
    }

    /* mark state as initialized */
    state->size = state->want;

    /* initialize write buffer if compressing */
    if (!state->direct) {
        strm->avail_out = state->size;
        strm->next_out = state->out;
        state->x.next = strm->next_out;
    }
    return 0;
}